

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii.c
# Opt level: O1

int coda_ascii_close(coda_product *product)

{
  int iVar1;
  int iVar2;
  
  iVar1 = coda_bin_product_close((coda_bin_product *)product);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (product->filename != (char *)0x0) {
      free(product->filename);
    }
    if (product[1].root_type != (coda_dynamic_type *)0x0) {
      free(product[1].root_type);
    }
    if ((coda_type *)product[1].product_variable_size != (coda_type *)0x0) {
      coda_type_release((coda_type *)product[1].product_variable_size);
    }
    free(product);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int coda_ascii_close(coda_product *product)
{
    coda_ascii_product *product_file = (coda_ascii_product *)product;

    if (coda_bin_product_close((coda_bin_product *)product_file) != 0)
    {
        return -1;
    }

    if (product_file->filename != NULL)
    {
        free(product_file->filename);
    }

    if (product_file->asciiline_end_offset != NULL)
    {
        free(product_file->asciiline_end_offset);
    }
    if (product_file->asciilines != NULL)
    {
        coda_type_release(product_file->asciilines);
    }

    free(product_file);

    return 0;
}